

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O0

int Ver_ParseConnectDefBoxes(Ver_Man_t *pMan)

{
  int iVar1;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pObj;
  int local_34;
  int local_30;
  int RetValue;
  int k;
  int i;
  Abc_Obj_t *pBox;
  Abc_Ntk_t *pNtk;
  Ver_Man_t *pMan_local;
  
  local_34 = 1;
  RetValue = 0;
  do {
    iVar1 = Vec_PtrSize(pMan->pDesign->vModules);
    if (iVar1 <= RetValue) {
      return local_34;
    }
    pNtk_00 = (Abc_Ntk_t *)Vec_PtrEntry(pMan->pDesign->vModules,RetValue);
    for (local_30 = 0; iVar1 = Vec_PtrSize(pNtk_00->vBoxes), local_30 < iVar1;
        local_30 = local_30 + 1) {
      pObj = Abc_NtkBox(pNtk_00,local_30);
      iVar1 = Abc_ObjIsLatch(pObj);
      if ((iVar1 == 0) && ((pObj->field_5).pData != (void *)0x0)) {
        iVar1 = Ver_NtkIsDefined((Abc_Ntk_t *)(pObj->field_5).pData);
        if (iVar1 == 0) {
          local_34 = 2;
        }
        else {
          iVar1 = Ver_ParseConnectBox(pMan,pObj);
          if (iVar1 == 0) {
            return 0;
          }
          iVar1 = Abc_NtkHasBlackbox((Abc_Ntk_t *)(pObj->field_5).pData);
          if (iVar1 == 0) {
            Abc_ObjBlackboxToWhitebox(pObj);
          }
        }
      }
    }
    RetValue = RetValue + 1;
  } while( true );
}

Assistant:

int Ver_ParseConnectDefBoxes( Ver_Man_t * pMan )
{
    Abc_Ntk_t * pNtk;
    Abc_Obj_t * pBox;
    int i, k, RetValue = 1;
    // go through all the modules
    Vec_PtrForEachEntry( Abc_Ntk_t *, pMan->pDesign->vModules, pNtk, i )
    {
        // go through all the boxes of this module
        Abc_NtkForEachBox( pNtk, pBox, k )
        {
            if ( Abc_ObjIsLatch(pBox) )
                continue;
            // skip internal boxes of the blackboxes
            if ( pBox->pData == NULL )
                continue;
            // if the network is undefined, it will be connected later
            if ( !Ver_NtkIsDefined((Abc_Ntk_t *)pBox->pData) )
            {
                RetValue = 2;
                continue;
            }
            // connect the box
            if ( !Ver_ParseConnectBox( pMan, pBox ) )
                return 0;
            // if the network is a true blackbox, skip
            if ( Abc_NtkHasBlackbox((Abc_Ntk_t *)pBox->pData) )
                continue;
            // convert the box to the whitebox
            Abc_ObjBlackboxToWhitebox( pBox );
        }
    }
    return RetValue;
}